

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

uint32_t GoodOAAT(char *key,int len,uint32_t seed)

{
  uint uVar1;
  uint uVar2;
  uint32_t h2;
  uint32_t h1;
  uchar *end;
  uchar *str;
  uint32_t seed_local;
  int len_local;
  char *key_local;
  
  h1 = seed ^ 0x3b00;
  h2 = seed << 0xf | seed >> 0x11;
  for (str = (uchar *)key; str != (uchar *)(key + len); str = str + 1) {
    h1 = (*str + h1) * 9;
    h2 = ((h1 + h2) * 0x80 | h1 + h2 >> 0x19) * 5;
  }
  uVar1 = (h2 << 0xe | h2 >> 0x12) + (h2 ^ h1);
  uVar2 = (uVar1 >> 6 | uVar1 * 0x4000000) + (uVar1 ^ h2);
  uVar1 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar2 ^ uVar1);
  return (uVar1 >> 8 | uVar1 * 0x1000000) + (uVar1 ^ uVar2);
}

Assistant:

uint32_t
GoodOAAT(const char *key, int len, uint32_t seed) {
#define grol(x,n) (((x)<<(n))|((x)>>(32-(n))))
#define gror(x,n) (((x)>>(n))|((x)<<(32-(n))))
  unsigned char  *str = (unsigned char *)key;
  const unsigned char *const end = (const unsigned char *)str + len;
  uint32_t h1 = seed ^ 0x3b00;
  uint32_t h2 = grol(seed, 15);
  for (;str != end; str++) {
    h1 += str[0];
    h1 += h1 << 3; // h1 *= 9
    h2 += h1;
    // the rest could be as in MicroOAAT: h1 = grol(h1, 7)
    // but clang doesn't generate ROTL instruction then.
    h2 = grol(h2, 7);
    h2 += h2 << 2; // h2 *= 5
  }
  h1 ^= h2;
  /* now h1 passes all collision checks,
   * so it is suitable for hash-tables with prime numbers. */
  h1 += grol(h2, 14);
  h2 ^= h1; h2 += gror(h1, 6);
  h1 ^= h2; h1 += grol(h2, 5);
  h2 ^= h1; h2 += gror(h1, 8);
  return h2;
#undef grol
#undef gror
}